

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O3

void __thiscall mario::EventLoop::assertInLoopThread(EventLoop *this)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  iVar1 = this->_threadId;
  iVar2 = *(int *)(in_FS_OFFSET + -8);
  if (iVar2 == 0) {
    CurrentThread::cacheTid();
    iVar2 = *(int *)(in_FS_OFFSET + -8);
  }
  if (iVar1 == iVar2) {
    return;
  }
  abortNotInLoopThread(this);
  return;
}

Assistant:

void assertInLoopThread() {
		if (!isInLoopThread()) {
			abortNotInLoopThread();
		}
	}